

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::ProgramUniformCase::iterate(ProgramUniformCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  GLuint programA_00;
  deUint32 dVar4;
  undefined4 uVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  size_type __n;
  reference pvVar8;
  char *pcVar9;
  TestError *pTVar10;
  GLSLVersion glslVersion;
  GLSLVersion glslVersion_00;
  allocator<char> local_341;
  int unifLocation;
  allocator<char> local_319;
  string local_318;
  ProgramSources local_2f8;
  undefined1 local_228 [8];
  ShaderProgram progNoLink;
  string local_150 [4];
  uint pos;
  string fragNoMain;
  string local_110;
  string local_f0 [8];
  string frag;
  string vtx;
  GLenum err;
  vector<char,_std::allocator<char>_> shaderbuf;
  size_t length;
  undefined1 local_70 [4];
  int seed;
  string fragSrc;
  char *shaderSrc [1];
  GLuint pipeline;
  GLuint programB;
  GLuint programA;
  int i;
  DataType dType [5];
  Functions *gl;
  ProgramUniformCase *this_local;
  undefined8 *puVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  puVar7 = (undefined8 *)CONCAT44(extraout_var,iVar3);
  _programA = 0x1f0000001b;
  dType[0] = TYPE_FLOAT;
  dType[1] = TYPE_FLOAT_MAT2;
  dType[2] = TYPE_FLOAT_MAT2X3;
  for (programB = 0; (int)programB < 5; programB = programB + 1) {
    shaderSrc[0]._0_4_ = 0;
    std::__cxx11::string::string((string *)local_70);
    iVar3 = programB * 1000;
    generateUniformFragSrc(this,(string *)local_70,this->m_glslVersion,(&programA)[(int)programB]);
    shaderbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         std::__cxx11::string::size();
    __n = shaderbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&err,__n,
               (allocator_type *)(vtx.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(vtx.field_2._M_local_buf + 0xf));
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&err,0);
    std::__cxx11::string::copy
              (local_70,(ulong)pvVar8,
               shaderbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&err,
                        shaderbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    *pvVar8 = '\0';
    fragSrc.field_2._8_8_ =
         std::vector<char,_std::allocator<char>_>::operator[]
                   ((vector<char,_std::allocator<char>_> *)&err,0);
    programA_00 = (*(code *)puVar7[0x7f])(0x8b30,1,(undefined1 *)((long)&fragSrc.field_2 + 8));
    shaderSrc[0]._4_4_ =
         (*(code *)puVar7[0x7f])(0x8b30,1,(undefined1 *)((long)&fragSrc.field_2 + 8));
    bVar2 = glu::isDataTypeMatrix((&programA)[(int)programB]);
    if (bVar2) {
      setAndCompareMatrixUniforms
                (this,(GLuint)shaderSrc[0],programA_00,shaderSrc[0]._4_4_,(&programA)[(int)programB]
                 ,iVar3 + 1000);
      (*(code *)puVar7[0xdb])(1,shaderSrc);
      (*(code *)puVar7[0x13])((GLuint)shaderSrc[0]);
      (*(code *)puVar7[0x2d1])((GLuint)shaderSrc[0],2,programA_00);
      setAndCompareMatrixUniforms
                (this,(GLuint)shaderSrc[0],programA_00,shaderSrc[0]._4_4_,(&programA)[(int)programB]
                 ,iVar3 + 0x44c);
      (*(code *)*puVar7)((GLuint)shaderSrc[0],shaderSrc[0]._4_4_);
      setAndCompareMatrixUniforms
                (this,(GLuint)shaderSrc[0],programA_00,shaderSrc[0]._4_4_,(&programA)[(int)programB]
                 ,iVar3 + 0x4b0);
    }
    else {
      setAndCompareUniforms
                (this,(GLuint)shaderSrc[0],programA_00,shaderSrc[0]._4_4_,(&programA)[(int)programB]
                 ,iVar3 + 1000);
      (*(code *)puVar7[0xdb])(1,shaderSrc);
      (*(code *)puVar7[0x13])((GLuint)shaderSrc[0]);
      (*(code *)puVar7[0x2d1])((GLuint)shaderSrc[0],2,programA_00);
      setAndCompareUniforms
                (this,(GLuint)shaderSrc[0],programA_00,shaderSrc[0]._4_4_,(&programA)[(int)programB]
                 ,iVar3 + 0x44c);
      (*(code *)*puVar7)((GLuint)shaderSrc[0],shaderSrc[0]._4_4_);
      setAndCompareUniforms
                (this,(GLuint)shaderSrc[0],programA_00,shaderSrc[0]._4_4_,(&programA)[(int)programB]
                 ,iVar3 + 0x4b0);
    }
    (*(code *)puVar7[0x89])(programA_00);
    (*(code *)puVar7[0x89])(shaderSrc[0]._4_4_);
    (*(code *)puVar7[0x8a])(1,shaderSrc);
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&err);
    std::__cxx11::string::~string((string *)local_70);
  }
  std::__cxx11::string::string((string *)(frag.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_f0);
  generateBasicVertexSrc_abi_cxx11_(&local_110,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::operator=((string *)(frag.field_2._M_local_buf + 8),(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  generateBasicFragmentSrc_abi_cxx11_
            ((string *)((long)&fragNoMain.field_2 + 8),(glcts *)(ulong)this->m_glslVersion,
             glslVersion_00);
  std::__cxx11::string::operator=(local_f0,(string *)(fragNoMain.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(fragNoMain.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_150,local_f0);
  progNoLink.m_program.m_info.linkTimeUs._4_4_ =
       std::__cxx11::string::find((char *)local_150,0x2a988e8);
  std::__cxx11::string::replace
            ((ulong)local_150,(ulong)progNoLink.m_program.m_info.linkTimeUs._4_4_,&DAT_00000004);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,pcVar9,&local_319);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&unifLocation,pcVar9,&local_341);
  glu::makeVtxFragSources(&local_2f8,&local_318,(string *)&unifLocation);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_228,pRVar6,&local_2f8);
  glu::ProgramSources::~ProgramSources(&local_2f8);
  std::__cxx11::string::~string((string *)&unifLocation);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  pcVar1 = (code *)puVar7[0x20b];
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_228);
  (*pcVar1)(dVar4,0x8258,1);
  pcVar1 = (code *)puVar7[0x19d];
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_228);
  (*pcVar1)(dVar4);
  pcVar1 = (code *)puVar7[0x169];
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_228);
  uVar5 = (*pcVar1)(dVar4,"u_color");
  pcVar1 = (code *)puVar7[0x226];
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_228);
  (*pcVar1)(0x3f800000,0x3f800000,0x3f800000,dVar4,uVar5);
  vtx.field_2._8_4_ = (*(code *)puVar7[0x100])();
  if (vtx.field_2._8_4_ != 0x502) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"ProgramUniformi failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x7b0);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = (code *)puVar7[0x89];
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_228);
  (*pcVar1)(dVar4);
  pcVar1 = (code *)puVar7[0x226];
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_228);
  (*pcVar1)(0x3f800000,0x3f800000,0x3f800000,dVar4);
  vtx.field_2._8_4_ = (*(code *)puVar7[0x100])();
  if (vtx.field_2._8_4_ != 0x501) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"ProgramUniformi failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x7b9);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_228);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)(frag.field_2._M_local_buf + 8));
  return STOP;
}

Assistant:

IterateResult iterate(void)
	{
		const glw::Functions& gl	   = m_context.getRenderContext().getFunctions();
		glu::DataType		  dType[5] = { glu::TYPE_INT, glu::TYPE_UINT, glu::TYPE_FLOAT, glu::TYPE_FLOAT_MAT2,
								   glu::TYPE_FLOAT_MAT2X3 };

		// Loop over the various data types, generate fragment programs, and test uniforms
		// (MAT2 means stands for all square matrices, MAT2x3 stands for all non-square matrices)
		for (int i = 0; i < 5; i++)
		{
			glw::GLuint programA, programB;
			glw::GLuint pipeline = 0;
			const char* shaderSrc[1];
			std::string fragSrc;
			int			seed = 1000 + (1000 * i);

			generateUniformFragSrc(fragSrc, m_glslVersion, dType[i]);

			size_t			  length = fragSrc.size();
			std::vector<char> shaderbuf(length + 1);
			fragSrc.copy(&shaderbuf[0], length);
			shaderbuf[length] = '\0';
			shaderSrc[0]	  = &shaderbuf[0];
			programA		  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, shaderSrc);
			programB		  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, shaderSrc);

			if (isDataTypeMatrix(dType[i]))
			{
				// programs are unbound
				setAndCompareMatrixUniforms(pipeline, programA, programB, dType[i], seed);

				// bind one program with useProgramStages
				gl.genProgramPipelines(1, &pipeline);
				gl.bindProgramPipeline(pipeline);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programA);
				seed += 100;
				setAndCompareMatrixUniforms(pipeline, programA, programB, dType[i], seed);

				// make an active program with activeShaderProgram
				gl.activeShaderProgram(pipeline, programB);
				seed += 100;
				setAndCompareMatrixUniforms(pipeline, programA, programB, dType[i], seed);
			}
			else
			{
				// programs are unbound
				setAndCompareUniforms(pipeline, programA, programB, dType[i], seed);

				// bind one program with useProgramStages
				gl.genProgramPipelines(1, &pipeline);
				gl.bindProgramPipeline(pipeline);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programA);
				seed += 100;
				setAndCompareUniforms(pipeline, programA, programB, dType[i], seed);

				// make an active program with activeShaderProgram
				gl.activeShaderProgram(pipeline, programB);
				seed += 100;
				setAndCompareUniforms(pipeline, programA, programB, dType[i], seed);
			}

			gl.deleteProgram(programA);
			gl.deleteProgram(programB);
			gl.deleteProgramPipelines(1, &pipeline);
		}

		// Negative Cases

		// Program that is not successfully linked
		glw::GLenum err;
		std::string vtx;
		std::string frag;

		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		// remove the main keyword so it doesn't link
		std::string  fragNoMain = frag;
		unsigned int pos		= (unsigned int)fragNoMain.find("main");
		fragNoMain.replace(pos, 4, "niaM");
		glu::ShaderProgram progNoLink(m_context.getRenderContext(),
									  glu::makeVtxFragSources(vtx.c_str(), fragNoMain.c_str()));
		gl.programParameteri(progNoLink.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progNoLink.getProgram());
		int unifLocation = gl.getUniformLocation(progNoLink.getProgram(), "u_color");
		gl.programUniform4f(progNoLink.getProgram(), unifLocation, 1.0, 1.0, 1.0, 1.0);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("ProgramUniformi failed");
		}

		// deleted program
		gl.deleteProgram(progNoLink.getProgram());
		gl.programUniform4f(progNoLink.getProgram(), unifLocation, 1.0, 1.0, 1.0, 1.0);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("ProgramUniformi failed");
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}